

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O2

void __thiscall
Js::SourceTextModuleRecord::SetParent
          (SourceTextModuleRecord *this,SourceTextModuleRecord *parentRecord,LPCOLESTR moduleName)

{
  Recycler *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *alloc;
  List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar4;
  undefined1 local_58 [8];
  TrackAllocData data;
  LPCOLESTR moduleName_local;
  SourceTextModuleRecord *parentRecord_local;
  
  data._32_8_ = moduleName;
  moduleName_local = (LPCOLESTR)parentRecord;
  if (parentRecord == (SourceTextModuleRecord *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                ,0x2ec,"(parentRecord != nullptr)","parentRecord != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  EnsureChildModuleSet(parentRecord,(this->scriptContext).ptr);
  bVar2 = JsUtil::
          BaseDictionary<const_char16_t_*,_Js::SourceTextModuleRecord_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::ContainsKey((parentRecord->childrenModuleSet).ptr,(char16_t **)&data.line);
  if (!bVar2) {
    local_58 = (undefined1  [8])this;
    JsUtil::
    BaseDictionary<char16_t_const*,Js::SourceTextModuleRecord*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<char16_t_const*,Js::SourceTextModuleRecord*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
              ((BaseDictionary<char16_t_const*,Js::SourceTextModuleRecord*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)(parentRecord->childrenModuleSet).ptr,(char16_t **)&data.line,
               (SourceTextModuleRecord **)local_58);
    pLVar4 = (this->parentModuleList).ptr;
    if (pLVar4 == (List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   *)0x0) {
      this_00 = ((this->scriptContext).ptr)->recycler;
      local_58 = (undefined1  [8])
                 &JsUtil::
                  List<Js::SourceTextModuleRecord*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>
                  ::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_586c2f7;
      data.filename._0_4_ = 0x2f5;
      alloc = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_58);
      pLVar4 = (List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                *)new<Memory::Recycler>(0x30,alloc,0x37a1d4);
      (pLVar4->super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>).
      alloc = this_00;
      (pLVar4->super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>).
      _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_01387f90;
      (pLVar4->super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>).
      buffer.ptr = (WriteBarrierPtr<Js::SourceTextModuleRecord> *)0x0;
      (pLVar4->super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>).
      count = 0;
      pLVar4->length = 0;
      pLVar4->increment = 4;
      Memory::
      WriteBarrierPtr<JsUtil::List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
      ::WriteBarrierSet(&this->parentModuleList,pLVar4);
      pLVar4 = (this->parentModuleList).ptr;
    }
    bVar2 = JsUtil::ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>::
            Contains(&pLVar4->
                      super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>
                     ,(SourceTextModuleRecord **)&moduleName_local);
    if (!bVar2) {
      JsUtil::
      List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::Add((this->parentModuleList).ptr,(SourceTextModuleRecord **)&moduleName_local);
    }
    if (this->evaluating == true) {
      *(int *)(moduleName_local + 0x7e) = *(int *)(moduleName_local + 0x7e) + 1;
    }
  }
  return;
}

Assistant:

void SourceTextModuleRecord::SetParent(SourceTextModuleRecord* parentRecord, LPCOLESTR moduleName)
    {
        Assert(parentRecord != nullptr);
        parentRecord->EnsureChildModuleSet(GetScriptContext());
        if (!parentRecord->childrenModuleSet->ContainsKey(moduleName))
        {
            parentRecord->childrenModuleSet->AddNew(moduleName, this);

            if (this->parentModuleList == nullptr)
            {
                Recycler* recycler = GetScriptContext()->GetRecycler();
                this->parentModuleList = RecyclerNew(recycler, ModuleRecordList, recycler);
            }

            if (!this->parentModuleList->Contains(parentRecord))
            {
                this->parentModuleList->Add(parentRecord);
            }

            if (IsEvaluating())
            {
                parentRecord->IncrementAwaited();
            }
        }
    }